

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O0

uint64_t *
Hacl_RSAPSS_new_rsapss_load_skey
          (uint32_t modBits,uint32_t eBits,uint32_t dBits,uint8_t *nb,uint8_t *eb,uint8_t *db)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  _Bool b0;
  uint64_t m1;
  _Bool b;
  uint64_t m;
  uint64_t m10;
  uint64_t m0;
  uint64_t *e;
  uint64_t *r2;
  uint64_t *n;
  uint32_t nLen2;
  uint32_t ebLen1;
  uint32_t nbLen1;
  uint64_t *d;
  uint64_t *pkey;
  uint32_t pkeyLen;
  uint32_t eLen1;
  uint32_t nLen1;
  uint32_t dbLen;
  uint64_t *skey2;
  uint64_t *skey1;
  uint64_t *skey;
  uint32_t skeyLen;
  uint32_t dLen;
  uint32_t eLen;
  uint32_t nLen;
  uint32_t dLen_1;
  uint32_t eLen_2;
  uint32_t nLen_2;
  _Bool ite;
  uint32_t eLen_1;
  uint32_t nLen_1;
  _Bool ite0;
  uint8_t *db_local;
  uint8_t *eb_local;
  uint8_t *nb_local;
  uint32_t dBits_local;
  uint32_t eBits_local;
  uint32_t modBits_local;
  
  if ((modBits < 2) || (eBits == 0)) {
    bVar1 = false;
  }
  else {
    uVar2 = (modBits - 1 >> 6) + 1;
    uVar3 = (eBits - 1 >> 6) + 1;
    bVar1 = false;
    if ((uVar2 < 0x2000000) && (bVar1 = false, uVar3 < 0x4000000)) {
      bVar1 = uVar2 * 2 <= -uVar3 - 1;
    }
  }
  if ((bVar1) && (dBits != 0)) {
    uVar2 = (dBits - 1 >> 6) + 1;
    bVar1 = false;
    if (uVar2 < 0x4000000) {
      bVar1 = ((modBits - 1 >> 6) + 1) * 2 <= (-1 - ((eBits - 1 >> 6) + 1)) - uVar2;
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar1) {
    uVar2 = ((modBits - 1 >> 6) + 1) * 2 + (eBits - 1 >> 6) + (dBits - 1 >> 6) + 2;
    if (0x1fffffffffffffff < (ulong)uVar2) {
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_RSAPSS.c"
             ,0x2d9);
      exit(0xfd);
    }
    _eBits_local = (uint64_t *)calloc((ulong)uVar2,8);
    if (_eBits_local != (uint64_t *)0x0) {
      uVar2 = (modBits - 1 >> 6) + 1;
      Hacl_Bignum_Convert_bn_from_bytes_be_uint64((modBits - 1 >> 3) + 1,nb,_eBits_local);
      Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64
                ((modBits - 1 >> 6) + 1,modBits - 1,_eBits_local,_eBits_local + uVar2);
      Hacl_Bignum_Convert_bn_from_bytes_be_uint64
                ((eBits - 1 >> 3) + 1,eb,_eBits_local + (ulong)uVar2 + (ulong)uVar2);
      uVar4 = check_modulus_u64(modBits,_eBits_local);
      uVar5 = check_exponent_u64(eBits,_eBits_local + (ulong)uVar2 + (ulong)uVar2);
      Hacl_Bignum_Convert_bn_from_bytes_be_uint64
                ((dBits - 1 >> 3) + 1,db,
                 _eBits_local + (((modBits - 1 >> 6) + 1) * 2 + (eBits - 1 >> 6) + 1));
      uVar6 = check_exponent_u64(dBits,_eBits_local +
                                       (((modBits - 1 >> 6) + 1) * 2 + (eBits - 1 >> 6) + 1));
      if ((uVar4 & uVar5) != 0xffffffffffffffff || uVar6 != 0xffffffffffffffff) {
        free(_eBits_local);
        _eBits_local = (uint64_t *)0x0;
      }
    }
  }
  else {
    _eBits_local = (uint64_t *)0x0;
  }
  return _eBits_local;
}

Assistant:

uint64_t
*Hacl_RSAPSS_new_rsapss_load_skey(
  uint32_t modBits,
  uint32_t eBits,
  uint32_t dBits,
  uint8_t *nb,
  uint8_t *eb,
  uint8_t *db
)
{
  bool ite0;
  if (1U < modBits && 0U < eBits)
  {
    uint32_t nLen = (modBits - 1U) / 64U + 1U;
    uint32_t eLen = (eBits - 1U) / 64U + 1U;
    ite0 = nLen <= 33554431U && eLen <= 67108863U && nLen + nLen <= 0xffffffffU - eLen;
  }
  else
  {
    ite0 = false;
  }
  bool ite;
  if (ite0 && 0U < dBits)
  {
    uint32_t nLen = (modBits - 1U) / 64U + 1U;
    uint32_t eLen = (eBits - 1U) / 64U + 1U;
    uint32_t dLen = (dBits - 1U) / 64U + 1U;
    ite = dLen <= 67108863U && 2U * nLen <= 0xffffffffU - eLen - dLen;
  }
  else
  {
    ite = false;
  }
  if (!ite)
  {
    return NULL;
  }
  uint32_t nLen = (modBits - 1U) / 64U + 1U;
  uint32_t eLen = (eBits - 1U) / 64U + 1U;
  uint32_t dLen = (dBits - 1U) / 64U + 1U;
  uint32_t skeyLen = nLen + nLen + eLen + dLen;
  KRML_CHECK_SIZE(sizeof (uint64_t), skeyLen);
  uint64_t *skey = (uint64_t *)KRML_HOST_CALLOC(skeyLen, sizeof (uint64_t));
  if (skey == NULL)
  {
    return skey;
  }
  uint64_t *skey1 = skey;
  uint64_t *skey2 = skey1;
  uint32_t dbLen = (dBits - 1U) / 8U + 1U;
  uint32_t nLen1 = (modBits - 1U) / 64U + 1U;
  uint32_t eLen1 = (eBits - 1U) / 64U + 1U;
  uint32_t pkeyLen = nLen1 + nLen1 + eLen1;
  uint64_t *pkey = skey2;
  uint64_t *d = skey2 + pkeyLen;
  uint32_t nbLen1 = (modBits - 1U) / 8U + 1U;
  uint32_t ebLen1 = (eBits - 1U) / 8U + 1U;
  uint32_t nLen2 = (modBits - 1U) / 64U + 1U;
  uint64_t *n = pkey;
  uint64_t *r2 = pkey + nLen2;
  uint64_t *e = pkey + nLen2 + nLen2;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(nbLen1, nb, n);
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64((modBits - 1U) / 64U + 1U, modBits - 1U, n, r2);
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(ebLen1, eb, e);
  uint64_t m0 = check_modulus_u64(modBits, n);
  uint64_t m10 = check_exponent_u64(eBits, e);
  uint64_t m = m0 & m10;
  bool b = m == 0xFFFFFFFFFFFFFFFFULL;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(dbLen, db, d);
  uint64_t m1 = check_exponent_u64(dBits, d);
  bool b0 = b && m1 == 0xFFFFFFFFFFFFFFFFULL;
  if (b0)
  {
    return skey2;
  }
  KRML_HOST_FREE(skey2);
  return NULL;
}